

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O2

bool __thiscall
sptk::ScalarOperation::AddMultiplicationOperation(ScalarOperation *this,double multiplier)

{
  ModuleInterface *pMVar1;
  _func_int **pp_Var2;
  ModuleInterface *local_20;
  
  pMVar1 = (ModuleInterface *)operator_new(0x10);
  pp_Var2 = (_func_int **)operator_new(0x10);
  *pp_Var2 = (_func_int *)&PTR__OperationInterface_00114530;
  pp_Var2[1] = (_func_int *)multiplier;
  pMVar1->_vptr_ModuleInterface = (_func_int **)&PTR__OperationPerformer_001144b0;
  pMVar1[1]._vptr_ModuleInterface = pp_Var2;
  local_20 = pMVar1;
  std::
  vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
  ::emplace_back<sptk::ScalarOperation::ModuleInterface*>
            ((vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
              *)&this->modules_,&local_20);
  return true;
}

Assistant:

bool ScalarOperation::AddMultiplicationOperation(double multiplier) {
  modules_.push_back(new OperationPerformer(new Multiplication(multiplier)));
  return true;
}